

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_rounding.cpp
# Opt level: O2

FractionPrecision * icu_63::number::Precision::constructFraction(int32_t minFrac,int32_t maxFrac)

{
  FractionPrecision *in_RDI;
  
  (in_RDI->super_Precision).fType = RND_FRACTION;
  (in_RDI->super_Precision).fUnion.fracSig.fMinFrac = (digits_t)minFrac;
  (in_RDI->super_Precision).fUnion.fracSig.fMaxFrac = (digits_t)maxFrac;
  *(undefined4 *)((long)&(in_RDI->super_Precision).fUnion + 4) = 0xffffffff;
  (in_RDI->super_Precision).fRoundingMode = UNUM_FOUND_HALFEVEN;
  return in_RDI;
}

Assistant:

FractionPrecision Precision::constructFraction(int32_t minFrac, int32_t maxFrac) {
    FractionSignificantSettings settings;
    settings.fMinFrac = static_cast<digits_t>(minFrac);
    settings.fMaxFrac = static_cast<digits_t>(maxFrac);
    settings.fMinSig = -1;
    settings.fMaxSig = -1;
    PrecisionUnion union_;
    union_.fracSig = settings;
    return {RND_FRACTION, union_, kDefaultMode};
}